

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O0

cmList * __thiscall
cmList::
insert_items<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (cmList *this,index_type index,
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          first,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                last,ExpandElements expandElements,EmptyElements emptyElements)

{
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  const_iterator local_40;
  size_type local_38;
  difference_type offset;
  EmptyElements emptyElements_local;
  ExpandElements expandElements_local;
  index_type index_local;
  cmList *this_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  last_local;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  first_local;
  
  offset._0_4_ = emptyElements;
  offset._4_4_ = expandElements;
  _emptyElements_local = index;
  index_local = (index_type)this;
  this_local = (cmList *)last._M_current;
  last_local = first;
  local_38 = ComputeInsertIndex(this,index,true);
  local_50._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)begin_abi_cxx11_(this);
  local_48 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator+(&local_50,local_38);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_40,&local_48);
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (this,local_40,last_local,
             (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )this_local,offset._4_4_,(EmptyElements)offset);
  return this;
}

Assistant:

cmList& insert_items(index_type index, InputIterator first,
                       InputIterator last,
                       ExpandElements expandElements = ExpandElements::Yes,
                       EmptyElements emptyElements = EmptyElements::No)
  {
    auto const offset =
      static_cast<difference_type>(this->ComputeInsertIndex(index));
    this->insert(this->begin() + offset, first, last, expandElements,
                 emptyElements);
    return *this;
  }